

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

int main(void)

{
  test_readers_writers_with_handle_pool(10,1,1,4,false,0x1e);
  test_readers_writers_with_handle_pool(10,1,4,4,false,0x1e);
  test_readers_writers_with_handle_pool(5,1,4,4,true,0x1e);
  test_readers_writers_with_handle_pool(10,5,4,4,true,0x1e);
  return 0;
}

Assistant:

int main() {

    /* Test single writer with multiple readers sharing a common
       pool of file handles, over single file for 30 seconds */
    test_readers_writers_with_handle_pool(10       /*number of handles*/,
                                          1        /*number of files*/,
                                          1        /*writer count*/,
                                          4        /*reader count*/,
                                          false    /*do not use snap handle pool*/,
                                          30       /*test time in seconds*/);

    /* Test multiple writers with multiple readers sharing a common
       pool of file handles, over single file for 30 seconds */
    test_readers_writers_with_handle_pool(10       /*number of handles*/,
                                          1        /*number of files*/,
                                          4        /*writer count*/,
                                          4        /*reader count*/,
                                          false    /*do not use snap handle pool*/,
                                          30       /*test time in seconds*/);

    /* Test multiple writers sharing a common pool of file handles
       and multiple readers sharing a common pool of snapshot handles,
       over single file for 30 seconds */
    test_readers_writers_with_handle_pool(5        /*number of handles*/,
                                          1        /*number of files*/,
                                          4        /*writer count*/,
                                          4        /*reader count*/,
                                          true     /*use snap handle pool*/,
                                          30       /*test time in seconds*/);

    /* Test multiple writers sharing a common pool of file handles
       and multiple readers sharing a common pool of snapshot handles,
       over multiple files for 30 seconds */
    test_readers_writers_with_handle_pool(10       /*number of handles*/,
                                          5        /*number of files*/,
                                          4        /*writer count*/,
                                          4        /*reader count*/,
                                          true     /*use snap handle pool*/,
                                          30       /*test time in seconds*/);

    return 0;
}